

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

bam_pileup1_t * bam_plp_next(bam_plp_t iter,int *_tid,int *_pos,int *_n_plp)

{
  int *piVar1;
  ulong uVar2;
  __linkbuf_t *p_Var3;
  __linkbuf_t *p_Var4;
  ushort uVar5;
  bam_pileup1_t *__ptr;
  int iVar6;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  lbnode_t *plVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int l3;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  lbnode_t *p;
  
  if (iter->error == 0) {
    *_n_plp = 0;
    iVar8 = iter->is_eof;
    if ((iVar8 == 0) || (iter->head->next != (__linkbuf_t *)0x0)) {
      do {
        if ((iVar8 == 0) && (iter->max_tid <= iter->tid)) {
          if (iter->max_tid != iter->tid) {
            return (bam_pileup1_t *)0x0;
          }
          if (iter->max_pos <= iter->pos) {
            return (bam_pileup1_t *)0x0;
          }
        }
        p = iter->head;
        plVar10 = iter->dummy;
        plVar10->next = p;
        iVar8 = 0;
        while (p->next != (__linkbuf_t *)0x0) {
          iVar6 = (p->b).core.tid;
          if (iVar6 < iter->tid) {
LAB_0013357f:
            overlap_remove(iter,&p->b);
            plVar10->next = p->next;
            mp_free(iter->mp,p);
            p = plVar10;
          }
          else if (iVar6 == iter->tid) {
            iVar6 = iter->pos;
            if (p->end <= iVar6) goto LAB_0013357f;
            if (p->beg <= iVar6) {
              __ptr = iter->plp;
              if (iVar8 == iter->max_plp) {
                iVar6 = iVar8 * 2;
                if (iVar8 == 0) {
                  iVar6 = 0x100;
                }
                iter->max_plp = iVar6;
                __ptr = (bam_pileup1_t *)realloc(__ptr,(long)iVar6 * 0x18);
                iter->plp = __ptr;
                iVar6 = iter->pos;
              }
              __ptr[iVar8].b = &p->b;
              uVar2 = *(ulong *)&(p->b).core.field_0x8;
              puVar7 = (uint *)((p->b).data + (uVar2 >> 0x18 & 0xff));
              iVar13 = (p->s).k;
              uVar11 = (ulong)iVar13;
              uVar5 = (ushort)(uVar2 >> 0x30);
              if (uVar11 == 0xffffffffffffffff) {
                if (uVar5 == 1) {
                  uVar11 = 0xffffffffffffffff;
                  if (((*puVar7 & 0xf) < 9) &&
                     (uVar11 = 0xffffffffffffffff, (0x181U >> (*puVar7 & 0xf) & 1) != 0)) {
                    (p->s).k = 0;
                    (p->s).x = (p->b).core.pos;
                    (p->s).y = 0;
                    uVar11 = 0;
                  }
                }
                else {
                  iVar13 = (p->b).core.pos;
                  (p->s).x = iVar13;
                  (p->s).y = 0;
                  iVar15 = 0;
                  uVar11 = 0;
                  while( true ) {
                    if (uVar2 >> 0x30 <= uVar11) {
                      __assert_fail("k < c->n_cigar",
                                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                    ,0x550,
                                    "int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)");
                    }
                    uVar12 = puVar7[uVar11];
                    if (((uVar12 & 0xd) == 0) || (uVar14 = uVar12 & 0xf, uVar14 - 7 < 2)) break;
                    if ((uVar14 == 1) || (uVar14 == 4)) {
                      iVar15 = iVar15 + (uVar12 >> 4);
                      (p->s).y = iVar15;
                    }
                    else if (uVar14 == 3) {
                      iVar13 = iVar13 + (uVar12 >> 4);
                      (p->s).x = iVar13;
                    }
                    uVar11 = uVar11 + 1;
                  }
                  (p->s).k = (int)uVar11;
                }
              }
              else {
                uVar12 = puVar7[uVar11] >> 4;
                iVar15 = (p->s).x;
                if ((int)uVar12 <= iVar6 - iVar15) {
                  if ((int)(uint)uVar5 <= iVar13) {
                    __assert_fail("s->k < c->n_cigar",
                                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                  ,0x556,"int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)")
                    ;
                  }
                  uVar14 = puVar7[uVar11 + 1];
                  uVar17 = puVar7[uVar11] & 0xf;
                  if ((((uVar14 & 0xf) == 8) || ((uVar14 & 0xd) == 0)) || ((uVar14 & 0xb) == 3)) {
                    if ((uVar17 < 9) && ((0x181U >> uVar17 & 1) != 0)) {
                      piVar1 = &(p->s).y;
                      *piVar1 = *piVar1 + uVar12;
                    }
                    (p->s).x = iVar15 + uVar12;
                    uVar11 = (ulong)(iVar13 + 1);
                  }
                  else {
                    if ((uVar17 < 9) && ((0x181U >> uVar17 & 1) != 0)) {
                      piVar1 = &(p->s).y;
                      *piVar1 = *piVar1 + uVar12;
                    }
                    (p->s).x = iVar15 + uVar12;
                    while (uVar11 = uVar11 + 1, (long)uVar11 < (long)(uVar2 >> 0x30)) {
                      uVar12 = puVar7[uVar11];
                      uVar14 = uVar12 & 0xf;
                      if (((uVar14 == 8) || ((uVar12 & 0xd) == 0)) || ((uVar12 & 0xb) == 3)) break;
                      if ((uVar14 == 4) || (uVar14 == 1)) {
                        piVar1 = &(p->s).y;
                        *piVar1 = *piVar1 + (uVar12 >> 4);
                      }
                    }
                  }
                  (p->s).k = (int)uVar11;
                  if ((int)(uint)uVar5 <= (int)uVar11) {
                    __assert_fail("s->k < c->n_cigar",
                                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                                  ,0x566,"int resolve_cigar2(bam_pileup1_t *, int32_t, cstate_t *)")
                    ;
                  }
                }
              }
              uVar12 = puVar7[(int)uVar11];
              uVar14 = *(uint *)&__ptr[iVar8].field_0x14;
              __ptr[iVar8].indel = 0;
              uVar14 = uVar14 & 0xfffffff6;
              *(uint *)&__ptr[iVar8].field_0x14 = uVar14;
              iVar13 = (p->s).x;
              if ((uVar12 >> 4) + iVar13 + -1 == iVar6) {
                iVar15 = (p->s).k;
                uVar2 = *(ulong *)&(p->b).core.field_0x8;
                uVar17 = (uint)(ushort)(uVar2 >> 0x30);
                if (iVar15 + 1 < (int)uVar17) {
                  uVar9 = puVar7[(long)iVar15 + 1] & 0xf;
                  uVar16 = puVar7[(long)iVar15 + 1] >> 4;
                  if (uVar9 == 1) {
LAB_00133888:
                    __ptr[iVar8].indel = uVar16;
                  }
                  else if (uVar9 == 6) {
                    uVar11 = (long)iVar15 + 2;
                    if ((int)uVar11 < (int)uVar17) {
                      uVar16 = 0;
                      for (; uVar2 >> 0x30 != uVar11; uVar11 = uVar11 + 1) {
                        uVar17 = puVar7[uVar11];
                        if ((uVar17 & 0xf) == 1) {
                          uVar16 = uVar16 + (uVar17 >> 4);
                        }
                        else if ((((uVar17 & 0xf) == 8) || ((uVar17 & 0xd) == 0)) ||
                                ((uVar17 & 0xb) == 3)) break;
                      }
                      if (0 < (int)uVar16) goto LAB_00133888;
                    }
                  }
                  else if (uVar9 == 2) {
                    uVar16 = -uVar16;
                    goto LAB_00133888;
                  }
                }
              }
              if ((uVar12 & 7) == 0 || (uVar12 & 0xf) == 7) {
                __ptr[iVar8].qpos = (iVar6 - iVar13) + (p->s).y;
              }
              else if ((uVar12 & 0xe) == 2) {
                *(uint *)&__ptr[iVar8].field_0x14 = uVar14 | 1;
                __ptr[iVar8].qpos = (p->s).y;
                uVar14 = uVar14 + (uint)((uVar12 & 0xf) == 3) * 8 + 1;
                *(uint *)&__ptr[iVar8].field_0x14 = uVar14;
              }
              uVar12 = (uVar14 & 0xfffffffd) + (uint)((p->b).core.pos == iVar6) * 2;
              *(uint *)&__ptr[iVar8].field_0x14 = uVar12;
              *(uint *)&__ptr[iVar8].field_0x14 =
                   (uVar12 & 0xfffffffb) + (uint)((p->s).end == iVar6) * 4;
              iVar8 = iVar8 + 1;
            }
          }
          plVar10 = p;
          p = plVar10->next;
        }
        p_Var3 = iter->dummy->next;
        iter->head = p_Var3;
        *_n_plp = iVar8;
        *_tid = iter->tid;
        iVar6 = iter->pos;
        *_pos = iVar6;
        p_Var4 = p_Var3->next;
        iVar13 = (p_Var3->b).core.tid;
        if (iVar13 < iter->tid && p_Var4 != (__linkbuf_t *)0x0) {
          fprintf(_stderr,"[%s] unsorted input. Pileup aborts.\n","bam_plp_next");
          iter->error = 1;
          *_n_plp = -1;
          return (bam_pileup1_t *)0x0;
        }
        if (iter->tid < iVar13) {
          iter->tid = iVar13;
          iVar13 = p_Var3->beg;
        }
        else {
          iVar13 = iVar6 + 1;
          if (iVar6 < p_Var3->beg) {
            iVar13 = p_Var3->beg;
          }
        }
        iter->pos = iVar13;
        if (iVar8 != 0) {
          return iter->plp;
        }
        iVar8 = iter->is_eof;
      } while (iVar8 == 0 || p_Var4 != (__linkbuf_t *)0x0);
    }
  }
  else {
    *_n_plp = -1;
  }
  return (bam_pileup1_t *)0x0;
}

Assistant:

const bam_pileup1_t *bam_plp_next(bam_plp_t iter, int *_tid, int *_pos, int *_n_plp)
{
    if (iter->error) { *_n_plp = -1; return 0; }
    *_n_plp = 0;
    if (iter->is_eof && iter->head->next == 0) return 0;
    while (iter->is_eof || iter->max_tid > iter->tid || (iter->max_tid == iter->tid && iter->max_pos > iter->pos)) {
        int n_plp = 0;
        lbnode_t *p, *q;
        // write iter->plp at iter->pos
        iter->dummy->next = iter->head;
        for (p = iter->head, q = iter->dummy; p->next; q = p, p = p->next) {
            if (p->b.core.tid < iter->tid || (p->b.core.tid == iter->tid && p->end <= iter->pos)) { // then remove
                overlap_remove(iter, &p->b);
                q->next = p->next; mp_free(iter->mp, p); p = q;
            } else if (p->b.core.tid == iter->tid && p->beg <= iter->pos) { // here: p->end > pos; then add to pileup
                if (n_plp == iter->max_plp) { // then double the capacity
                    iter->max_plp = iter->max_plp? iter->max_plp<<1 : 256;
                    iter->plp = (bam_pileup1_t*)realloc(iter->plp, sizeof(bam_pileup1_t) * iter->max_plp);
                }
                iter->plp[n_plp].b = &p->b;
                if (resolve_cigar2(iter->plp + n_plp, iter->pos, &p->s)) ++n_plp; // actually always true...
            }
        }
        iter->head = iter->dummy->next; // dummy->next may be changed
        *_n_plp = n_plp; *_tid = iter->tid; *_pos = iter->pos;
        // update iter->tid and iter->pos
        if (iter->head->next) {
            if (iter->tid > iter->head->b.core.tid) {
                fprintf(stderr, "[%s] unsorted input. Pileup aborts.\n", __func__);
                iter->error = 1;
                *_n_plp = -1;
                return 0;
            }
        }
        if (iter->tid < iter->head->b.core.tid) { // come to a new reference sequence
            iter->tid = iter->head->b.core.tid; iter->pos = iter->head->beg; // jump to the next reference
        } else if (iter->pos < iter->head->beg) { // here: tid == head->b.core.tid
            iter->pos = iter->head->beg; // jump to the next position
        } else ++iter->pos; // scan contiguously
        // return
        if (n_plp) return iter->plp;
        if (iter->is_eof && iter->head->next == 0) break;
    }
    return 0;
}